

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

FUNCTION_RETURN __thiscall license::Project::initialize(Project *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  char cVar5;
  runtime_error *prVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  path publicKeyFile;
  string privateKey;
  path destinationDir;
  path privateKeyFile;
  path include_folder;
  string private_key_file_str;
  path p;
  path local_2f8;
  _Head_base<0UL,_license::CryptoHelper_*,_false> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  path local_290;
  string local_270;
  path local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  pcVar3 = (this->m_project_folder)._M_dataplus._M_p;
  local_230 = (undefined1  [8])local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,pcVar3,pcVar3 + (this->m_project_folder)._M_string_length);
  local_2f8.m_pathname._M_dataplus._M_p = (pointer)&local_2f8.m_pathname.field_2;
  pcVar3 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,pcVar3,pcVar3 + (this->m_name)._M_string_length);
  boost::filesystem::path::operator/=((path *)local_230,&local_2f8);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  if (local_230 == (undefined1  [8])local_220) {
    local_2b0.field_2._8_8_ = local_220[0]._8_8_;
  }
  else {
    local_2b0._M_dataplus._M_p = (pointer)local_230;
  }
  local_2b0._M_string_length = local_228;
  local_228 = 0;
  local_220[0]._M_allocated_capacity = local_220[0]._M_allocated_capacity & 0xffffffffffffff00;
  local_230 = (undefined1  [8])local_220;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_2f8.m_pathname._M_dataplus._M_p != &local_2f8.m_pathname.field_2) &&
     (operator_delete(local_2f8.m_pathname._M_dataplus._M_p),
     local_230 != (undefined1  [8])local_220)) {
    operator_delete((void *)local_230);
  }
  local_290.m_pathname._M_dataplus._M_p = (pointer)&local_290.m_pathname.field_2;
  local_290.m_pathname.field_2._M_allocated_capacity._0_4_ = 0x6c636e69;
  local_290.m_pathname.field_2._M_allocated_capacity._4_3_ = 0x656475;
  local_290.m_pathname._M_string_length = 7;
  local_290.m_pathname.field_2._M_local_buf[7] = '\0';
  local_2f8.m_pathname._M_dataplus._M_p = (pointer)&local_2f8.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  boost::filesystem::path::operator/=(&local_2f8,&local_290);
  paVar8 = &local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity = 0x6365736e6563696c;
  local_2d0.field_2._8_2_ = 99;
  local_2d0._M_string_length = 9;
  local_2d0._M_dataplus._M_p = (pointer)paVar8;
  boost::filesystem::path::operator/=(&local_2f8,(path *)&local_2d0);
  paVar1 = &local_2f8.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_pathname._M_dataplus._M_p == paVar1) {
    local_220[0]._12_4_ = local_2f8.m_pathname.field_2._12_4_;
    local_220[0]._8_4_ = local_2f8.m_pathname.field_2._8_4_;
    local_230 = (undefined1  [8])local_220;
  }
  else {
    local_230 = (undefined1  [8])local_2f8.m_pathname._M_dataplus._M_p;
  }
  local_220[0]._M_allocated_capacity._4_4_ =
       local_2f8.m_pathname.field_2._M_allocated_capacity._4_4_;
  local_220[0]._M_allocated_capacity._0_4_ =
       local_2f8.m_pathname.field_2._M_allocated_capacity._0_4_;
  local_228 = local_2f8.m_pathname._M_string_length;
  local_2f8.m_pathname._M_string_length = 0;
  local_2f8.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_2f8.m_pathname.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar2 = &local_250.m_pathname.field_2;
  pcVar3 = (this->m_name)._M_dataplus._M_p;
  local_2f8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  local_250.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar3,pcVar3 + (this->m_name)._M_string_length);
  boost::filesystem::path::operator/=((path *)local_230,&local_250);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  if (local_230 == (undefined1  [8])local_220) {
    local_270.field_2._8_8_ = local_220[0]._8_8_;
  }
  else {
    local_270._M_dataplus._M_p = (pointer)local_230;
  }
  local_270._M_string_length = local_228;
  local_228 = 0;
  local_220[0]._M_allocated_capacity = local_220[0]._M_allocated_capacity & 0xffffffffffffff00;
  local_230 = (undefined1  [8])local_220;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_250.m_pathname._M_dataplus._M_p != paVar2) &&
     (operator_delete(local_250.m_pathname._M_dataplus._M_p),
     local_230 != (undefined1  [8])local_220)) {
    operator_delete((void *)local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar8) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_pathname._M_dataplus._M_p != &local_2f8.m_pathname.field_2) {
    operator_delete(local_2f8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_pathname._M_dataplus._M_p != &local_290.m_pathname.field_2) {
    operator_delete(local_290.m_pathname._M_dataplus._M_p);
  }
  local_230 = (undefined1  [8])local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"public_key.h","");
  local_2f8.m_pathname._M_dataplus._M_p = (pointer)&local_2f8.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,local_270._M_dataplus._M_p,
             local_270._M_dataplus._M_p + local_270._M_string_length);
  boost::filesystem::path::operator/=(&local_2f8,(path *)local_230);
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230);
  }
  local_230 = (undefined1  [8])local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"private_key.rsa","");
  local_290.m_pathname._M_dataplus._M_p = (pointer)&local_290.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  boost::filesystem::path::operator/=(&local_290,(path *)local_230);
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230);
  }
  boost::filesystem::detail::status((detail *)local_230,(path *)&local_2b0,(error_code *)0x0);
  if ((uint)local_230._0_4_ < 2) {
    cVar5 = boost::filesystem::detail::create_directories((path *)&local_2b0,(error_code *)0x0);
    if ((cVar5 == '\0') ||
       (cVar5 = boost::filesystem::detail::create_directories((path *)&local_270,(error_code *)0x0),
       cVar5 == '\0')) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_2d0,"Cannot create destination directory [",&local_2b0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_230 = (undefined1  [8])*plVar7;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if (local_230 == (undefined1  [8])paVar8) {
        local_220[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_220[0]._8_8_ = plVar7[3];
        local_230 = (undefined1  [8])local_220;
      }
      else {
        local_220[0]._0_8_ = paVar8->_M_allocated_capacity;
      }
      local_228 = plVar7[1];
      *plVar7 = (long)paVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_230);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar9 = false;
  }
  else {
    local_2d0._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"private_key.rsa","");
    local_230 = (undefined1  [8])local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_230,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    boost::filesystem::path::operator/=((path *)local_230,(path *)&local_2d0);
    boost::filesystem::detail::status((detail *)&local_250,(path *)local_230,(error_code *)0x0);
    uVar4 = (uint)local_250.m_pathname._M_dataplus._M_p;
    bVar9 = 1 < (uint)local_250.m_pathname._M_dataplus._M_p;
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar8) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((1 < uVar4) && (this->m_force_overwrite != false)) {
      local_2d0._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"private_key.rsa","");
      local_230 = (undefined1  [8])local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,local_2b0._M_dataplus._M_p,
                 local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
      boost::filesystem::path::operator/=((path *)local_230,(path *)&local_2d0);
      boost::filesystem::detail::remove((path *)local_230,(error_code *)0x0);
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar8) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      bVar9 = false;
      boost::filesystem::detail::remove(&local_2f8,(error_code *)0x0);
    }
    boost::filesystem::detail::status((detail *)local_230,(path *)&local_270,(error_code *)0x0);
    if (((uint)local_230._0_4_ < 2) &&
       (cVar5 = boost::filesystem::detail::create_directories((path *)&local_270,(error_code *)0x0),
       cVar5 == '\0')) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_2d0,"Cannot create public key directory [",&local_270);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_230 = (undefined1  [8])*plVar7;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if (local_230 == (undefined1  [8])paVar8) {
        local_220[0]._0_8_ = paVar8->_M_allocated_capacity;
        local_220[0]._8_8_ = plVar7[3];
        local_230 = (undefined1  [8])local_220;
      }
      else {
        local_220[0]._0_8_ = paVar8->_M_allocated_capacity;
      }
      local_228 = plVar7[1];
      *plVar7 = (long)paVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_230);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  CryptoHelper::getInstance();
  if (bVar9) {
    boost::filesystem::detail::status((detail *)local_230,&local_2f8,(error_code *)0x0);
    if ((uint)local_230._0_4_ < 2) {
      (*(local_2d8._M_head_impl)->_vptr_CryptoHelper[3])(local_2d8._M_head_impl,&local_290);
      exportPublicKey(this,&local_270,
                      (unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)&local_2d8);
    }
  }
  else {
    std::ofstream::ofstream(local_230);
    (**(local_2d8._M_head_impl)->_vptr_CryptoHelper)();
    (*(local_2d8._M_head_impl)->_vptr_CryptoHelper[1])(&local_2d0);
    local_250.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,local_290.m_pathname._M_dataplus._M_p,
               local_290.m_pathname._M_dataplus._M_p + local_290.m_pathname._M_string_length);
    std::ofstream::open(local_230,(_Ios_Openmode)local_250.m_pathname._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
    std::ofstream::close();
    exportPublicKey(this,&local_270,
                    (unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                     *)&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.m_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar8) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _get;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2d8._M_head_impl != (CryptoHelper *)0x0) {
    (*(local_2d8._M_head_impl)->_vptr_CryptoHelper[7])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_pathname._M_dataplus._M_p != &local_290.m_pathname.field_2) {
    operator_delete(local_290.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_pathname._M_dataplus._M_p != &local_2f8.m_pathname.field_2) {
    operator_delete(local_2f8.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  return FUNC_RET_OK;
}

Assistant:

FUNCTION_RETURN Project::initialize() {
	const fs::path destinationDir(fs::path(m_project_folder) / m_name);
	const fs::path include_folder(publicKeyFolder(destinationDir, m_name));
	const fs::path publicKeyFile(include_folder / PUBLIC_KEY_INC_FNAME);
	const fs::path privateKeyFile(destinationDir / PRIVATE_KEY_FNAME);
	bool keyFilesExist = false;
	if (fs::exists(destinationDir)) {
		keyFilesExist = fs::exists(destinationDir / PRIVATE_KEY_FNAME);
		if (m_force_overwrite && keyFilesExist) {
			keyFilesExist = false;
			fs::remove(destinationDir / PRIVATE_KEY_FNAME);
			fs::remove(publicKeyFile);
		}
		if (!fs::exists(include_folder)) {
			if (!fs::create_directories(include_folder)) {
				throw std::runtime_error("Cannot create public key directory [" + include_folder.string() + "]");
			}
		}
	} else if (!fs::create_directories(destinationDir) || !fs::create_directories(include_folder)) {
		throw std::runtime_error("Cannot create destination directory [" + destinationDir.string() + "]");
	}
	FUNCTION_RETURN result = FUNC_RET_OK;
	unique_ptr<CryptoHelper> cryptoHelper(CryptoHelper::getInstance());
	if (keyFilesExist) {
		if (!fs::exists(publicKeyFile)) {
			// how strange, private key was found, but public key is not.
			// Let's regenerate public key
			cryptoHelper->loadPrivateKey_file(privateKeyFile.string());
			exportPublicKey(include_folder.string(), cryptoHelper);
		}
	} else {
		ofstream ofs;
		cryptoHelper->generateKeyPair();
		const std::string privateKey = cryptoHelper->exportPrivateKey();
		const string private_key_file_str = privateKeyFile.string();
		ofs.open(private_key_file_str.c_str(), std::fstream::trunc | std::fstream::binary);
		ofs << privateKey;
		ofs.close();
		exportPublicKey(include_folder.string(), cryptoHelper);
	}
	return result;
}